

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmjni.c
# Opt level: O0

jint Java_jportmidi_JPortMidiApi_Pm_1OpenInput
               (JNIEnv *env,jclass cl,jobject jstream,jint index,jstring extras,jint bufsiz)

{
  jclass p_Var1;
  undefined8 uVar2;
  jfieldID fid;
  jclass c;
  PortMidiStream *stream;
  PmError rslt;
  jint bufsiz_local;
  jstring extras_local;
  jobject p_Stack_20;
  jint index_local;
  jobject jstream_local;
  jclass cl_local;
  JNIEnv *env_local;
  
  stream._4_4_ = bufsiz;
  _rslt = extras;
  extras_local._4_4_ = index;
  p_Stack_20 = jstream;
  jstream_local = cl;
  cl_local = (jclass)env;
  p_Var1 = (*(*env)->GetObjectClass)(env,jstream);
  uVar2 = (**(code **)(*(long *)cl_local + 0x2f0))(cl_local,p_Var1,"address","J");
  stream._0_4_ = Pm_OpenInput(&c,extras_local._4_4_,(void *)0x0,stream._4_4_,(PmTimeProcPtr)0x0,
                              (void *)0x0);
  (**(code **)(*(long *)cl_local + 0x370))(cl_local,p_Stack_20,uVar2,c);
  return (PmError)stream;
}

Assistant:

JNICALL Java_jportmidi_JPortMidiApi_Pm_1OpenInput
  (JNIEnv *env, jclass cl, 
   jobject jstream, jint index, jstring extras, jint bufsiz)
{
    PmError rslt;
    PortMidiStream *stream;
    CLASS(c, jstream);
    ADDRESS_FID(fid, c);
    rslt = Pm_OpenInput(&stream, index, NULL, bufsiz, NULL, NULL);
    SET_PMSTREAM(jstream, fid, stream);
    return rslt;
}